

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O3

void rw::hanimInterpCB(void *vout,void *vin1,void *vin2,float32 t,void *param_5)

{
  float fVar1;
  float fVar2;
  float a;
  float fVar3;
  float fVar4;
  Quat QVar5;
  
  a = ((float)t - *(float *)((long)vin1 + 8)) /
      (*(float *)((long)vin2 + 8) - *(float *)((long)vin1 + 8));
  fVar3 = (float)*(undefined8 *)((long)vin1 + 0x1c);
  fVar4 = (float)((ulong)*(undefined8 *)((long)vin1 + 0x1c) >> 0x20);
  fVar1 = *(float *)((long)vin1 + 0x24);
  fVar2 = *(float *)((long)vin2 + 0x24);
  *(ulong *)((long)vout + 0x20) =
       CONCAT44(a * ((float)((ulong)*(undefined8 *)((long)vin2 + 0x1c) >> 0x20) - fVar4) + fVar4,
                a * ((float)*(undefined8 *)((long)vin2 + 0x1c) - fVar3) + fVar3);
  *(float *)((long)vout + 0x28) = (fVar2 - fVar1) * a + fVar1;
  QVar5 = slerp((Quat *)((long)vin1 + 0xc),(Quat *)((long)vin2 + 0xc),(float32)a);
  *(Quat *)((long)vout + 0x10) = QVar5;
  return;
}

Assistant:

static void
hanimInterpCB(void *vout, void *vin1, void *vin2, float32 t, void*)
{
	HAnimInterpFrame *out = (HAnimInterpFrame*)vout;
	HAnimKeyFrame *in1 = (HAnimKeyFrame*)vin1;
	HAnimKeyFrame *in2 = (HAnimKeyFrame*)vin2;
assert(t >= in1->time && t <= in2->time);
	float32 a = (t - in1->time)/(in2->time - in1->time);
	out->t =  lerp(in1->t, in2->t, a);
	out->q = slerp(in1->q, in2->q, a);
}